

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_infill_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  undefined8 *puVar1;
  llama_token_data *plVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  llama_token lVar8;
  size_t sVar9;
  float *pfVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float local_50;
  
  puVar1 = (undefined8 *)smpl->ctx;
  llama_sampler_softmax_impl(cur_p);
  if (cur_p->size == 0) {
    local_50 = 0.0;
    fVar19 = 0.0;
    uVar15 = 0;
  }
  else {
    fVar19 = 0.0;
    lVar16 = 0;
    local_50 = 0.0;
    uVar13 = 0;
    do {
      bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar1,
                                  *(llama_token *)((long)&cur_p->data->id + lVar16));
      fVar17 = *(float *)((long)&cur_p->data->p + lVar16);
      if (bVar5) {
        local_50 = local_50 + fVar17;
      }
      else {
        fVar19 = fVar19 + fVar17;
      }
      uVar15 = cur_p->size;
      uVar13 = uVar13 + 1;
      lVar16 = lVar16 + 0xc;
    } while (uVar13 < uVar15);
    local_50 = local_50 * 3.0;
  }
  if (local_50 * (float)uVar15 <= fVar19) {
    uVar15 = cur_p->size;
    if (uVar15 != 0) {
      uVar13 = 0;
      do {
        if (cur_p->size != 0) {
          lVar16 = 0;
          uVar15 = 0;
          do {
            plVar2 = cur_p->data;
            if (plVar2[uVar13].logit <= -INFINITY) break;
            if ((uVar13 != uVar15) && (-INFINITY < *(float *)((long)&plVar2->logit + lVar16))) {
              uVar6 = llama_vocab::token_to_piece
                                ((llama_vocab *)*puVar1,plVar2[uVar13].id,(char *)puVar1[1],
                                 *(int *)(puVar1 + 2) - (int)(char *)puVar1[1],0,false);
              if ((int)uVar6 < 0) {
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)(puVar1 + 1),(long)(int)uVar6);
                uVar6 = llama_vocab::token_to_piece
                                  ((llama_vocab *)*puVar1,cur_p->data[uVar13].id,(char *)puVar1[1],
                                   *(int *)(puVar1 + 2) - (int)(char *)puVar1[1],0,false);
              }
              iVar7 = llama_vocab::token_to_piece
                                ((llama_vocab *)*puVar1,
                                 *(llama_token *)((long)&cur_p->data->id + lVar16),(char *)puVar1[4]
                                 ,*(int *)(puVar1 + 5) - (int)(char *)puVar1[4],0,false);
              if (iVar7 < 0) {
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)(puVar1 + 4),(long)iVar7);
                iVar7 = llama_vocab::token_to_piece
                                  ((llama_vocab *)*puVar1,
                                   *(llama_token *)((long)&cur_p->data->id + lVar16),
                                   (char *)puVar1[4],*(int *)(puVar1 + 5) - (int)(char *)puVar1[4],0
                                   ,false);
              }
              if (((0 < (int)uVar6) && ((int)uVar6 <= iVar7)) &&
                 (iVar7 = bcmp((((vector<char,_std::allocator<char>_> *)(puVar1 + 1))->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start,
                               (((vector<char,_std::allocator<char>_> *)(puVar1 + 4))->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start,(ulong)uVar6), iVar7 == 0)) {
                plVar2 = cur_p->data;
                fVar19 = *(float *)((long)&plVar2->p + lVar16);
                bVar5 = fVar19 != plVar2[uVar13].p;
                bVar4 = plVar2[uVar13].p <= fVar19;
                uVar11 = uVar13;
                if (bVar4 && bVar5) {
                  uVar11 = uVar15;
                }
                iVar7 = (int)uVar15;
                if (bVar4 && bVar5) {
                  iVar7 = (int)uVar13;
                }
                plVar2[(int)uVar11].p = plVar2[iVar7].p + plVar2[(int)uVar11].p;
                plVar2[iVar7].logit = -INFINITY;
                plVar2[iVar7].p = 0.0;
              }
            }
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + 0xc;
          } while (uVar15 < cur_p->size);
        }
        uVar13 = uVar13 + 1;
        uVar15 = cur_p->size;
      } while (uVar13 < uVar15);
    }
    cur_p->size = 0;
    fVar19 = 0.0;
    if (uVar15 == 0) {
      lVar16 = 0;
    }
    else {
      lVar14 = 0;
      lVar16 = 0;
      do {
        bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar1,
                                    *(llama_token *)((long)&cur_p->data->id + lVar14));
        plVar2 = cur_p->data;
        if ((bVar5) ||
           (pfVar10 = (float *)((long)&plVar2->p + lVar14), 0.2 < *pfVar10 || *pfVar10 == 0.2)) {
          lVar16 = lVar16 + (ulong)!bVar5;
          fVar19 = fVar19 + *(float *)((long)&plVar2->p + lVar14);
          sVar9 = cur_p->size;
          cur_p->size = sVar9 + 1;
          plVar2[sVar9].p = *(float *)((long)&plVar2->p + lVar14);
          uVar3 = *(undefined8 *)((long)&plVar2->id + lVar14);
          plVar2[sVar9].id = (int)uVar3;
          plVar2[sVar9].logit = (float)(int)((ulong)uVar3 >> 0x20);
        }
        lVar14 = lVar14 + 0xc;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    if (lVar16 == 0) {
      cur_p->size = 1;
      lVar8 = llama_vocab::token_eot((llama_vocab *)*puVar1);
      plVar2 = cur_p->data;
      plVar2->id = lVar8;
      plVar2->logit = 1.0;
    }
    else {
      sVar9 = cur_p->size;
      if (sVar9 != 0) {
        pfVar10 = &cur_p->data->p;
        sVar12 = sVar9;
        do {
          *pfVar10 = *pfVar10 / fVar19;
          pfVar10 = pfVar10 + 3;
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      cur_p->size = 0;
      if (sVar9 == 0) {
        fVar19 = 0.0;
      }
      else {
        lVar16 = lVar16 + 1;
        auVar18._8_4_ = (int)((ulong)lVar16 >> 0x20);
        auVar18._0_8_ = lVar16;
        auVar18._12_4_ = 0x45300000;
        fVar17 = (float)(1.0 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)));
        fVar19 = 0.0;
        lVar16 = 0;
        do {
          bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar1,
                                      *(llama_token *)((long)&cur_p->data->id + lVar16));
          plVar2 = cur_p->data;
          if ((bVar5) ||
             (pfVar10 = (float *)((long)&plVar2->p + lVar16),
             fVar17 < *pfVar10 || fVar17 == *pfVar10)) {
            fVar19 = fVar19 + *(float *)((long)&plVar2->p + lVar16);
            sVar12 = cur_p->size;
            cur_p->size = sVar12 + 1;
            plVar2[sVar12].p = *(float *)((long)&plVar2->p + lVar16);
            uVar3 = *(undefined8 *)((long)&plVar2->id + lVar16);
            plVar2[sVar12].id = (int)uVar3;
            plVar2[sVar12].logit = (float)(int)((ulong)uVar3 >> 0x20);
          }
          lVar16 = lVar16 + 0xc;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
      sVar9 = cur_p->size;
      if (sVar9 != 0) {
        pfVar10 = &cur_p->data->p;
        do {
          *pfVar10 = *pfVar10 / fVar19;
          pfVar10 = pfVar10 + 3;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
    }
  }
  else {
    cur_p->size = 0;
    fVar19 = 0.0;
    if (uVar15 != 0) {
      lVar16 = 0;
      do {
        bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar1,
                                    *(llama_token *)((long)&cur_p->data->id + lVar16));
        if (bVar5) {
          plVar2 = cur_p->data;
          fVar19 = fVar19 + *(float *)((long)&plVar2->p + lVar16);
          sVar9 = cur_p->size;
          cur_p->size = sVar9 + 1;
          plVar2[sVar9].p = *(float *)((long)&plVar2->p + lVar16);
          uVar3 = *(undefined8 *)((long)&plVar2->id + lVar16);
          plVar2[sVar9].id = (int)uVar3;
          plVar2[sVar9].logit = (float)(int)((ulong)uVar3 >> 0x20);
        }
        lVar16 = lVar16 + 0xc;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
    sVar9 = cur_p->size;
    if (sVar9 != 0) {
      pfVar10 = &cur_p->data->p;
      do {
        *pfVar10 = *pfVar10 / fVar19;
        pfVar10 = pfVar10 + 3;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
  }
  return;
}

Assistant:

static void llama_sampler_infill_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_infill *) smpl->ctx;

    llama_sampler_softmax_impl(cur_p);

#if defined(GGML_DEBUG_SAMPLER_INFILL)
#define LOG_DBG_CUR LLAMA_LOG_DEBUG
#else
#define LOG_DBG_CUR(...)
#endif

    for (size_t i = 0; i < cur_p->size; ++i) {
        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    float p_txt_sum = 0.0f;
    float p_eog_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        if (ctx->vocab->is_eog(cur_p->data[i].id)) {
            p_eog_sum += cur_p->data[i].p;
        } else {
            p_txt_sum += cur_p->data[i].p;
        }
    }

    const float rat = p_eog_sum == 0.0 ? INFINITY : p_txt_sum / p_eog_sum; GGML_UNUSED(rat);

    LOG_DBG_CUR("%s: p_txt_sum = %.2f, p_eog_sum = %.2f, rat = %.2f, n = %zu\n", __func__, p_txt_sum, p_eog_sum, rat, cur_p->size);

    if (3*p_eog_sum*cur_p->size > p_txt_sum) {
        LOG_DBG_CUR("%s: the ratio p_txt/p_eog = %.2f is too low -> sampling EOG\n", __func__, p_txt_sum/p_eog_sum);

        // keep just the EOG tokens
        const auto size_org = cur_p->size;

        cur_p->size = 0;

        float p_sum = 0.0f;

        for (size_t i = 0; i < size_org; ++i) {
            if (ctx->vocab->is_eog(cur_p->data[i].id)) {
                p_sum += cur_p->data[i].p;

                cur_p->data[cur_p->size++] = cur_p->data[i];
            }
        }

        // normalize probs
        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= p_sum;
        }

        return;
    }

    size_t n_combined = 0; GGML_UNUSED(n_combined);

    // combine tokens with common prefix
    for (size_t i0 = 0; i0 < cur_p->size; ++i0) {
        for (size_t i1 = 0; i1 < cur_p->size; ++i1) {
            if (cur_p->data[i0].logit == -INFINITY) {
                break;
            }

            if (i0 == i1 || cur_p->data[i1].logit == -INFINITY) {
                continue;
            }

            int len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
            if (len0 < 0) {
                ctx->buf0.resize(len0);
                len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
                assert(len0 > 0);
            }

            int len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
            if (len1 < 0) {
                ctx->buf1.resize(len1);
                len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
                assert(len1 > 0);
            }

            // token i0 is a prefix of token i1
            if (len0 > 0 && len0 <= len1 && memcmp(ctx->buf0.data(), ctx->buf1.data(), len0) == 0) {
                int dst = i0;
                int src = i1;

                // merge into the token with higher probability
                if (cur_p->data[i1].p > cur_p->data[i0].p) {
                    std::swap(dst, src);
                }

                cur_p->data[dst].p += cur_p->data[src].p;
                cur_p->data[src].logit = -INFINITY;
                cur_p->data[src].p     = 0.0f;

                n_combined++;
            }
        }
    }

    size_t n_non_eog = 0;

    size_t size_org = cur_p->size;

    float p_sum = 0.0f;
    float thold = 0.2f;

    cur_p->size = 0;

    LOG_DBG_CUR("%s: n_combined = %zu, applying thold = %.3f\n", __func__, n_combined, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        if (!is_eog) {
            ++n_non_eog;
        }

        p_sum += cur_p->data[i].p;

        // keep this token
        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    LOG_DBG_CUR("%s: n_non_eog = %zu\n", __func__, n_non_eog);

    // if no non-EOG tokens are left -> reduce cur_p to single EOT token
    if (n_non_eog == 0) {
        cur_p->size = 1;
        cur_p->data[0].id = ctx->vocab->token_eot();
        cur_p->data[0].logit = 1.0f;

        return;
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    size_org = cur_p->size;
    p_sum = 0.0f;
    thold = 1.0/(n_non_eog + 1);

    cur_p->size = 0;

    LOG_DBG_CUR("%s: applying thold = %.3f\n", __func__, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        p_sum += cur_p->data[i].p;

        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

#undef LOG_DBG_CUR
}